

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O0

bool __thiscall TCPStream::waitForReadEvent(TCPStream *this,int timeout)

{
  int iVar1;
  long lVar2;
  fd_set *__arr;
  undefined1 auStack_a8 [4];
  uint __i;
  timeval tv;
  fd_set sdset;
  int timeout_local;
  TCPStream *this_local;
  
  _auStack_a8 = (long)timeout;
  tv.tv_sec = 0;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    sdset.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  lVar2 = (long)(this->m_sd / 0x40);
  sdset.fds_bits[lVar2 + -1] =
       1L << ((byte)((long)this->m_sd % 0x40) & 0x3f) | sdset.fds_bits[lVar2 + -1];
  iVar1 = select(this->m_sd + 1,(fd_set *)&tv.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                 (timeval *)auStack_a8);
  return 0 < iVar1;
}

Assistant:

bool TCPStream::waitForReadEvent(int timeout)
{
    fd_set sdset;
    struct timeval tv;

    tv.tv_sec = timeout;
    tv.tv_usec = 0;
    FD_ZERO(&sdset);
    FD_SET(m_sd, &sdset);
    return select(m_sd + 1, &sdset, nullptr, nullptr, &tv) > 0;
}